

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

bool ot::commissioner::CaseInsensitiveEqual(string *aLhs,string *aRhs)

{
  int iVar1;
  bool bVar2;
  string local_48;
  string local_28;
  
  utils::ToLower(&local_48,aLhs);
  utils::ToLower(&local_28,aRhs);
  if (local_48._M_string_length == local_28._M_string_length) {
    if (local_48._M_string_length == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_48._M_dataplus._M_p,local_28._M_dataplus._M_p,local_48._M_string_length);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return bVar2;
}

Assistant:

static inline bool CaseInsensitiveEqual(const std::string &aLhs, const std::string &aRhs)
{
    return ToLower(aLhs) == ToLower(aRhs);
}